

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

bool __thiscall
absl::time_internal::cctz::TimeZoneInfo::EquivTransitions
          (TimeZoneInfo *this,uint_fast8_t tt1_index,uint_fast8_t tt2_index)

{
  pointer pTVar1;
  
  if (tt1_index == tt2_index) {
    return true;
  }
  pTVar1 = (this->transition_types_).
           super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1[tt1_index].utc_offset == pTVar1[tt2_index].utc_offset) {
    if (pTVar1[tt1_index].is_dst == pTVar1[tt2_index].is_dst) {
      return pTVar1[tt1_index].abbr_index == pTVar1[tt2_index].abbr_index;
    }
  }
  return false;
}

Assistant:

bool TimeZoneInfo::EquivTransitions(std::uint_fast8_t tt1_index,
                                    std::uint_fast8_t tt2_index) const {
  if (tt1_index == tt2_index) return true;
  const TransitionType& tt1(transition_types_[tt1_index]);
  const TransitionType& tt2(transition_types_[tt2_index]);
  if (tt1.utc_offset != tt2.utc_offset) return false;
  if (tt1.is_dst != tt2.is_dst) return false;
  if (tt1.abbr_index != tt2.abbr_index) return false;
  return true;
}